

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

worker_t * __thiscall acto::core::runtime_t::create_worker(runtime_t *this)

{
  worker_t *this_00;
  __int_type_conflict _Var1;
  anon_class_1_0_00000001 local_39;
  function<void_()> local_38;
  worker_t *local_18;
  worker_t *result;
  runtime_t *this_local;
  
  result = (worker_t *)this;
  this_00 = (worker_t *)operator_new(0x98);
  std::function<void()>::function<acto::core::runtime_t::create_worker()::__0,void>
            ((function<void()> *)&local_38,&local_39);
  worker_t::worker_t(this_00,&this->super_callbacks,&local_38);
  std::function<void_()>::~function(&local_38);
  local_18 = this_00;
  _Var1 = std::__atomic_base<unsigned_long>::operator++
                    ((__atomic_base<unsigned_long> *)&this->workers_);
  if (_Var1 == 1) {
    event::reset(&this->no_workers_event_);
  }
  return local_18;
}

Assistant:

worker_t* runtime_t::create_worker() {
  worker_t* const result =
    new core::worker_t(this, [] { thread_context.is_worker_thread = true; });

  if (++workers_.count == 1) {
    no_workers_event_.reset();
  }

  return result;
}